

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O0

Builder * __thiscall
capnproto_test::capnp::test::TestDefaults::Builder::getDataList
          (Builder *__return_storage_ptr__,Builder *this)

{
  PointerBuilder builder;
  uint ptrIndex;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  ptrIndex = ::capnp::bounded<16u>();
  ::capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,ptrIndex);
  builder.capTable = local_28.capTable;
  builder.segment = local_28.segment;
  builder.pointer = local_28.pointer;
  ::capnp::_::PointerHelpers<capnp::List<capnp::Data,_(capnp::Kind)1>,_(capnp::Kind)6>::get
            (__return_storage_ptr__,builder,(word *)&DAT_00472aa8);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::List< ::capnp::Data,  ::capnp::Kind::BLOB>::Builder TestDefaults::Builder::getDataList() {
  return ::capnp::_::PointerHelpers< ::capnp::List< ::capnp::Data,  ::capnp::Kind::BLOB>>::get(_builder.getPointerField(
      ::capnp::bounded<16>() * ::capnp::POINTERS),
        ::capnp::schemas::bp_eb3f9ebe98c73cb6 + 822);
}